

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * fmt::v5::internal::
          format_decimal<wchar_t,unsigned_int,wchar_t*,fmt::v5::internal::add_thousands_sep<wchar_t>>
                    (wchar_t *out,uint value,int num_digits,add_thousands_sep<wchar_t> sep)

{
  add_thousands_sep<wchar_t> thousands_sep;
  type pwVar1;
  wchar_t *in_stack_00000008;
  wchar_t *in_stack_00000010;
  wchar_t *end;
  char_type buffer [13];
  int in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  wchar_t *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8 [16];
  
  thousands_sep._8_16_ = in_stack_ffffffffffffffb8;
  thousands_sep.sep_.data_ = in_stack_ffffffffffffffb0;
  format_decimal<unsigned_int,wchar_t,fmt::v5::internal::add_thousands_sep<wchar_t>>
            (in_stack_00000008,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,thousands_sep);
  pwVar1 = copy_str<wchar_t,wchar_t*,wchar_t*>
                     (in_stack_00000010,in_stack_00000008,(wchar_t *)0x16a0e5);
  return pwVar1;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}